

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,Am_Wrapper *in_value)

{
  Am_Value_Type AVar1;
  int iVar2;
  
  if (((short)this->type < 0) && ((this->value).wrapper_value != (Am_Wrapper *)0x0)) {
    Am_Wrapper::Release((this->value).wrapper_value);
  }
  (this->value).wrapper_value = in_value;
  if (in_value == (Am_Wrapper *)0x0) {
    AVar1 = 0xa000;
  }
  else {
    iVar2 = (**(in_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(in_value);
    AVar1 = (Am_Value_Type)iVar2;
  }
  this->type = AVar1;
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(Am_Wrapper *in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  value.wrapper_value = in_value;
  if (in_value)
    type = in_value->ID();
  else
    type = Am_WRAPPER_TYPE;
  return *this;
}